

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_QuicLegacyCodepointDisabled_Test::
QUICMethodTest_QuicLegacyCodepointDisabled_Test
          (QUICMethodTest_QuicLegacyCodepointDisabled_Test *this)

{
  QUICMethodTest_QuicLegacyCodepointDisabled_Test *this_local;
  
  QUICMethodTest::QUICMethodTest(&this->super_QUICMethodTest);
  (this->super_QUICMethodTest).super_Test._vptr_Test =
       (_func_int **)&PTR__QUICMethodTest_QuicLegacyCodepointDisabled_Test_00648288;
  return;
}

Assistant:

TEST_F(QUICMethodTest, QuicLegacyCodepointDisabled) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  uint8_t kClientParams[] = {1, 2, 3, 4};
  uint8_t kServerParams[] = {5, 6, 7};
  SSL_set_quic_use_legacy_codepoint(client_.get(), 0);
  SSL_set_quic_use_legacy_codepoint(server_.get(), 0);
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), kClientParams,
                                            sizeof(kClientParams)));
  ASSERT_TRUE(SSL_set_quic_transport_params(server_.get(), kServerParams,
                                            sizeof(kServerParams)));

  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectReceivedTransportParamsEqual(client_.get(), kServerParams);
  ExpectReceivedTransportParamsEqual(server_.get(), kClientParams);
}